

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

void __thiscall
cfd::core::MerkleBlock::MerkleBlock
          (MerkleBlock *this,Block *block,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids)

{
  uint64_t height_00;
  bool bVar1;
  reference txid_00;
  size_type sVar2;
  uint64_t uVar3;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  vector<bool,_std::allocator<bool>_> *this_00;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *this_01;
  vector<bool,_std::allocator<bool>_> local_e8;
  uint64_t local_c0;
  uint64_t height;
  Txid *target_txid;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *__range3;
  bool is_find;
  Txid *txid;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *__range2;
  undefined1 local_60 [8];
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> txid_list;
  vector<bool,_std::allocator<bool>_> target_indexes;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids_local;
  Block *block_local;
  MerkleBlock *this_local;
  
  this_00 = &this->bits_;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)0x707912);
  this_01 = &this->txids_;
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::vector(this_01);
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)0x707932);
  Block::GetTxids((vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)local_60,block);
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::size
            ((vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)local_60);
  ::std::vector<bool,_std::allocator<bool>_>::reserve
            (this_00,CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  __end2 = ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::begin
                     ((vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)local_60);
  txid = (Txid *)::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::end
                           ((vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)local_60);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<cfd::core::Txid_*,_std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>_>
                                *)&txid);
    if (!bVar1) {
      sVar2 = ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::size
                        ((vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)local_60);
      this->transaction_count = sVar2;
      ::std::vector<bool,_std::allocator<bool>_>::clear
                ((vector<bool,_std::allocator<bool>_> *)this_01);
      ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::clear(&this->txids_);
      local_c0 = 0;
      while (uVar3 = CalcTreeWidth(this->transaction_count,local_c0), height_00 = local_c0,
            1 < uVar3) {
        local_c0 = local_c0 + 1;
      }
      ::std::vector<bool,_std::allocator<bool>_>::vector
                (&local_e8,
                 (vector<bool,_std::allocator<bool>_> *)
                 &txid_list.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      TraverseAndBuild(this,height_00,0,
                       (vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)local_60,
                       &local_e8);
      ::std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x707b55);
      ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::~vector
                ((vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)local_60);
      ::std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x707b67);
      return;
    }
    txid_00 = __gnu_cxx::
              __normal_iterator<cfd::core::Txid_*,_std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>_>
              ::operator*(&__end2);
    __range3._7_1_ = false;
    __end3 = ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::begin(txids);
    target_txid = (Txid *)::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::end
                                    (txids);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_cfd::core::Txid_*,_std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>_>
                                       *)&target_txid), bVar1) {
      height = (uint64_t)
               __gnu_cxx::
               __normal_iterator<const_cfd::core::Txid_*,_std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>_>
               ::operator*(&__end3);
      bVar1 = Txid::Equals((Txid *)height,txid_00);
      if (bVar1) {
        __range3._7_1_ = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::core::Txid_*,_std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>_>
      ::operator++(&__end3);
    }
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)
               &txid_list.super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,__range3._7_1_);
    __gnu_cxx::
    __normal_iterator<cfd::core::Txid_*,_std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

MerkleBlock::MerkleBlock(const Block& block, const std::vector<Txid>& txids) {
  std::vector<bool> target_indexes;
  auto txid_list = block.GetTxids();
  target_indexes.reserve(txid_list.size());
  for (const auto& txid : txid_list) {
    bool is_find = false;
    for (const auto& target_txid : txids) {
      if (target_txid.Equals(txid)) {
        is_find = true;
        break;
      }
    }
    target_indexes.push_back(is_find);
  }

  transaction_count = static_cast<uint64_t>(txid_list.size());
  bits_.clear();
  txids_.clear();

  uint64_t height = 0;
  while (CalcTreeWidth(transaction_count, height) > 1) ++height;

  TraverseAndBuild(height, 0, txid_list, target_indexes);
}